

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

int * __thiscall pbrt::Tuple3<pbrt::Point3,_int>::operator[](Tuple3<pbrt::Point3,_int> *this,int i)

{
  int i_local;
  Tuple3<pbrt::Point3,_int> *this_local;
  Tuple3<pbrt::Point3,_int> *local_8;
  
  local_8 = this;
  if (i != 0) {
    if (i == 1) {
      local_8 = (Tuple3<pbrt::Point3,_int> *)&this->y;
    }
    else {
      local_8 = (Tuple3<pbrt::Point3,_int> *)&this->z;
    }
  }
  return &local_8->x;
}

Assistant:

PBRT_CPU_GPU
    T &operator[](int i) {
        DCHECK(i >= 0 && i <= 2);
        if (i == 0)
            return x;
        if (i == 1)
            return y;
        return z;
    }